

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

TokenType Grammar::matchTokenType(char *tokenType)

{
  bool bVar1;
  char *tokenType_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          MetricType_abi_cxx11_,tokenType);
  if (bVar1) {
    tokenType_local._4_4_ = MetricToken;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            NameType_abi_cxx11_,tokenType);
    if (bVar1) {
      tokenType_local._4_4_ = NameToken;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ObjectRefType_abi_cxx11_,tokenType);
      if (bVar1) {
        tokenType_local._4_4_ = ObjectRefToken;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )MaterialRefType_abi_cxx11_,tokenType);
        if (bVar1) {
          tokenType_local._4_4_ = MaterialRefToken;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)MetricKeyType_abi_cxx11_,tokenType);
          if (bVar1) {
            tokenType_local._4_4_ = MetricKeyToken;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)GeometryNodeType_abi_cxx11_,tokenType);
            if (bVar1) {
              tokenType_local._4_4_ = GeometryNodeToken;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CameraNodeType_abi_cxx11_,tokenType);
              if (bVar1) {
                tokenType_local._4_4_ = CameraNodeToken;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)LightNodeType_abi_cxx11_,tokenType);
                if (bVar1) {
                  tokenType_local._4_4_ = LightNodeToken;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)GeometryObjectType_abi_cxx11_,tokenType);
                  if (bVar1) {
                    tokenType_local._4_4_ = GeometryObjectToken;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CameraObjectType_abi_cxx11_,tokenType);
                    if (bVar1) {
                      tokenType_local._4_4_ = CameraObjectToken;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)LightObjectType_abi_cxx11_,tokenType);
                      if (bVar1) {
                        tokenType_local._4_4_ = LightObjectToken;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)TransformType_abi_cxx11_,tokenType);
                        if (bVar1) {
                          tokenType_local._4_4_ = TransformToken;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)MeshType_abi_cxx11_,tokenType);
                          if (bVar1) {
                            tokenType_local._4_4_ = MeshToken;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)VertexArrayType_abi_cxx11_,tokenType);
                            if (bVar1) {
                              tokenType_local._4_4_ = VertexArrayToken;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)IndexArrayType_abi_cxx11_,tokenType);
                              if (bVar1) {
                                tokenType_local._4_4_ = IndexArrayToken;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)MaterialType_abi_cxx11_,tokenType);
                                if (bVar1) {
                                  tokenType_local._4_4_ = MaterialToken;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)ColorType_abi_cxx11_,tokenType);
                                  if (bVar1) {
                                    tokenType_local._4_4_ = ColorToken;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)ParamType_abi_cxx11_,tokenType);
                                    if (bVar1) {
                                      tokenType_local._4_4_ = ParamToken;
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)TextureType_abi_cxx11_,tokenType);
                                      if (bVar1) {
                                        tokenType_local._4_4_ = TextureToken;
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)AttenType_abi_cxx11_,tokenType);
                                        if (bVar1) {
                                          tokenType_local._4_4_ = AttenToken;
                                        }
                                        else {
                                          tokenType_local._4_4_ = NoneType;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tokenType_local._4_4_;
}

Assistant:

static TokenType matchTokenType( const char *tokenType ) {
        if( MetricType == tokenType ) {
            return MetricToken;
        } else if(  NameType == tokenType ) {
            return NameToken;
        } else if( ObjectRefType == tokenType ) {
            return ObjectRefToken;
        } else if( MaterialRefType == tokenType ) {
            return MaterialRefToken;
        } else if( MetricKeyType == tokenType ) {
            return MetricKeyToken;
        } else if ( GeometryNodeType == tokenType ) {
            return GeometryNodeToken;
        } else if ( CameraNodeType == tokenType ) {
            return CameraNodeToken;
        } else if ( LightNodeType == tokenType ) {
            return LightNodeToken;
        } else if ( GeometryObjectType == tokenType ) {
            return GeometryObjectToken;
        } else if ( CameraObjectType == tokenType ) {
            return CameraObjectToken;
        } else if ( LightObjectType == tokenType ) {
            return LightObjectToken;
        } else if( TransformType == tokenType ) {
            return TransformToken;
        } else if( MeshType == tokenType ) {
            return MeshToken;
        } else if( VertexArrayType == tokenType ) {
            return VertexArrayToken;
        } else if( IndexArrayType == tokenType ) {
            return IndexArrayToken;
        } else if(  MaterialType == tokenType ) {
            return MaterialToken;
        } else if ( ColorType == tokenType ) {
            return ColorToken;
        } else if ( ParamType == tokenType ) {
            return ParamToken;
        } else if(  TextureType == tokenType ) {
            return TextureToken;
        } else if ( AttenType == tokenType ) {
            return AttenToken;
        }

        return NoneType;
    }